

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

void __thiscall LSM_tree::put(LSM_tree *this,uint64_t key,string *s,bool d)

{
  Skiplist *this_00;
  pointer ppLVar1;
  int iVar2;
  Level *in_RAX;
  Level *this_01;
  uint timer;
  Level *level;
  
  this_00 = &this->memtable;
  level = in_RAX;
  iVar2 = Skiplist::cap(this_00);
  if (((long)iVar2 + s->_M_string_length) - 0x1ffff8 < 0xffffffffffdfffff) {
    ppLVar1 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppLVar1 ==
        (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = (Level *)operator_new(0x28);
      Level::Level(this_01,0);
      level = this_01;
      std::vector<Level_*,_std::allocator<Level_*>_>::push_back(&this->disk,&level);
    }
    else {
      level = *ppLVar1;
    }
    timer = this->timer + 1;
    this->timer = timer;
    Level::flush_to_file(level,this_00,timer);
    compaction(this);
  }
  Skiplist::put(this_00,key,s,d);
  return;
}

Assistant:

void LSM_tree::put(uint64_t key, const std::string &s, bool d) {
    int size = memtable.cap();

    //---------------------------如果加上这个会超size 就先flush_to_file----------------//
    if (size + s.size() + 1 + sizeof(uint64_t) > MAX_SIZE) {

        Level *level;
        if (disk.empty()) {

            level = new Level(0);                                                                                          //reset里析构level
            disk.push_back(level);
        } else
            level = disk[0];


        //把memtable里的东西 写道文件 并且把 索引存到sstable 由level统一管理
        //注意timer 因为这里都是最新的 timer统一

        timer++;
        level->flush_to_file(memtable, timer);//已经把memtable清空

        compaction();
      // memtable.clear();
        //memtable.my_clear();
    }

    memtable.put(key, s, d);
}